

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_EscapeEncoding.cpp
# Opt level: O0

size_t axl::enc::EscapeEncodingDynamic::decode
                 (CharCodec *codec,Array<char,_axl::sl::ArrayDetails<char>_> *buffer,void *p0,
                 size_t size)

{
  int c_00;
  bool bVar1;
  utf32_t uVar2;
  int *piVar3;
  size_t sVar4;
  long in_RCX;
  ulong in_RDX;
  ulong uVar5;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *in_RSI;
  long *in_RDI;
  undefined1 auVar6 [16];
  utf32_t replace;
  utf32_t c;
  utf32_t *base;
  utf32_t *end;
  utf32_t *p;
  ConvertLengthResult result;
  utf32_t decodeBuffer [64];
  char *srcEnd;
  char *src;
  uint32_t decoderState;
  ulong_t hexCode;
  size_t hexCodeMaxLen;
  size_t hexCodeLen;
  char hexCodeString [16];
  Array<char,_axl::sl::ArrayDetails<char>_> encodeBuffer;
  State state;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe0c;
  Array<char,_axl::sl::ArrayDetails<char>_> *in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe50;
  int *length;
  Array<char,_axl::sl::ArrayDetails<char>_> *in_stack_fffffffffffffe58;
  Array<char,_axl::sl::ArrayDetails<char>_> *in_stack_fffffffffffffe60;
  int local_188 [64];
  ulong local_88;
  ulong local_80;
  undefined4 local_74;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  char local_58 [52];
  int local_24;
  long local_20;
  ulong local_18;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *local_10;
  long *local_8;
  
  local_24 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::clear
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x1a2caf);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::reserve
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x1a2cd1);
  local_74 = 0;
  local_80 = local_18;
  local_88 = local_18 + local_20;
  while (local_80 < local_88) {
    uVar7 = 0xfffd;
    auVar6 = (**(code **)(*local_8 + 0x98))
                       (local_8,&local_74,local_188,0x40,local_80,local_88 - local_80);
    if (auVar6._8_8_ == 0) break;
    local_80 = auVar6._8_8_ + local_80;
    length = local_188;
    piVar3 = length + auVar6._0_8_;
    while( true ) {
      if (piVar3 <= length) break;
      c_00 = *length;
      if (local_24 == 0) {
        if (c_00 == 0x5c) {
          appendEncoded_utf32(auVar6._8_8_,auVar6._0_8_,in_stack_fffffffffffffe60,
                              (utf32_t *)in_stack_fffffffffffffe58,(size_t)length);
          local_24 = 1;
        }
      }
      else if (local_24 == 1) {
        if (c_00 == 0x55) {
          local_24 = 2;
          local_60 = 0;
          local_68 = 8;
        }
        else if (c_00 == 0x75) {
          local_24 = 2;
          local_60 = 0;
          local_68 = 4;
        }
        else if (c_00 == 0x78) {
          local_24 = 2;
          local_60 = 0;
          local_68 = 2;
        }
        else {
          uVar2 = EscapeEncodingRoot::findEscapeReplaceChar(c_00);
          if (uVar2 != c_00) {
            appendEncoded_utf32(auVar6._8_8_,auVar6._0_8_,in_stack_fffffffffffffe60,
                                (utf32_t *)in_stack_fffffffffffffe58,(size_t)length);
          }
          local_24 = 0;
        }
      }
      else if (local_24 == 2) {
        bVar1 = EscapeEncodingRoot::isHexChar(c_00);
        if (bVar1) {
          uVar5 = local_60 + 1;
          local_58[local_60] = (char)c_00;
          local_60 = uVar5;
          if (uVar5 < local_68) goto LAB_001a3086;
        }
        local_58[local_60] = '\0';
        local_70 = strtoul(local_58,(char **)0x0,0x10);
        if (local_68 == 2) {
          sl::Array<char,_axl::sl::ArrayDetails<char>_>::append
                    (in_stack_fffffffffffffe10,(char *)CONCAT44(in_stack_fffffffffffffe0c,uVar7),
                     0x1a3048);
        }
        else {
          appendEncoded_utf32(auVar6._8_8_,auVar6._0_8_,in_stack_fffffffffffffe60,
                              (utf32_t *)in_stack_fffffffffffffe58,(size_t)length);
        }
        local_24 = 0;
      }
LAB_001a3086:
      length = length + 1;
    }
    if (local_24 == 0) {
      appendEncoded_utf32(auVar6._8_8_,auVar6._0_8_,in_stack_fffffffffffffe60,
                          (utf32_t *)in_stack_fffffffffffffe58,(size_t)length);
    }
  }
  sVar4 = sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(local_10);
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x1a30fd);
  return sVar4;
}

Assistant:

size_t
EscapeEncodingDynamic::decode(
	CharCodec* codec,
	sl::Array<char>* buffer,
	const void* p0,
	size_t size
) {
	enum State {
		State_Normal = 0,
		State_Escape,
		State_Hex,
	};

	State state = State_Normal;

	buffer->clear();
	buffer->reserve(size);

	sl::Array<char> encodeBuffer;
	char hexCodeString[16];
	size_t hexCodeLen;
	size_t hexCodeMaxLen;
	ulong_t hexCode;

	uint32_t decoderState = 0;
	const char* src = (char*)p0;
	const char* srcEnd = src + size;

	while (src < srcEnd) {
		utf32_t decodeBuffer[64];

		ConvertLengthResult result = codec->decode_utf32(
			&decoderState,
			decodeBuffer,
			countof(decodeBuffer),
			src,
			srcEnd - src
		);

		if (!result.m_srcLength)
			break;

		src += result.m_srcLength;

		const utf32_t* p = decodeBuffer;
		const utf32_t* end = p + result.m_dstLength;
		const utf32_t* base = p;

		for (; p < end; p++) {
			utf32_t c = *p;

			switch (state) {
			case State_Normal:
				if (c == '\\') {
					appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);
					state = State_Escape;
				}

				break;

			case State_Escape:
				switch (c) {
				case 'x':
					state = State_Hex;
					hexCodeLen = 0;
					hexCodeMaxLen = 2;
					break;

				case 'u':
					state = State_Hex;
					hexCodeLen = 0;
					hexCodeMaxLen = 4;
					break;

				case 'U':
					state = State_Hex;
					hexCodeLen = 0;
					hexCodeMaxLen = 8;
					break;

				default:
					utf32_t replace = findEscapeReplaceChar(c);
					if (replace != c) {
						appendEncoded_utf32(codec, buffer, &encodeBuffer, &replace, 1);
						base = p + 1;
					} else {
						base = p;
					}

					state = State_Normal;
				}

				break;

			case State_Hex:
				if (isHexChar(c)) {
					hexCodeString[hexCodeLen++] = (char)c;
					if (hexCodeLen < hexCodeMaxLen)
						break;

					base = p + 1;
				} else {
					base = p;
				}

				hexCodeString[hexCodeLen] = 0;
				hexCode = strtoul(hexCodeString, NULL, 16);

				if (hexCodeMaxLen == 2) // \x
					buffer->append((const char*)&hexCode, 1);
				else // \u or \U
					appendEncoded_utf32(codec, buffer, &encodeBuffer, (utf32_t*)&hexCode, 1);

				state = State_Normal;
				break;
			}
		}

		if (state == State_Normal) // otherwise, unterminated escape
			appendEncoded_utf32(codec, buffer, &encodeBuffer, base, p - base);
	}

	return buffer->getCount();
}